

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.c
# Opt level: O0

void gdImageDestroy(gdImagePtr im)

{
  int local_14;
  int i;
  gdImagePtr im_local;
  
  if (im->pixels != (uchar **)0x0) {
    for (local_14 = 0; local_14 < im->sy; local_14 = local_14 + 1) {
      gdFree(im->pixels[local_14]);
    }
    gdFree(im->pixels);
  }
  if (im->tpixels != (int **)0x0) {
    for (local_14 = 0; local_14 < im->sy; local_14 = local_14 + 1) {
      gdFree(im->tpixels[local_14]);
    }
    gdFree(im->tpixels);
  }
  if (im->polyInts != (int *)0x0) {
    gdFree(im->polyInts);
  }
  if (im->style != (int *)0x0) {
    gdFree(im->style);
  }
  gdFree(im);
  return;
}

Assistant:

BGD_DECLARE(void) gdImageDestroy (gdImagePtr im)
{
	int i;
	if (im->pixels) {
		for (i = 0; (i < im->sy); i++) {
			gdFree (im->pixels[i]);
		}
		gdFree (im->pixels);
	}
	if (im->tpixels) {
		for (i = 0; (i < im->sy); i++) {
			gdFree (im->tpixels[i]);
		}
		gdFree (im->tpixels);
	}
	if (im->polyInts) {
		gdFree (im->polyInts);
	}
	if (im->style) {
		gdFree (im->style);
	}
	gdFree (im);
}